

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

int AF_AActor_CheckPosition
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AActor *thing;
  DVector2 local_40;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_0041dbe7;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0041dbd7:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0041dbe7:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x723,
                  "int AF_AActor_CheckPosition(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  thing = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (thing == (AActor *)0x0) goto LAB_0041db28;
    bVar1 = DObject::IsKindOf((DObject *)thing,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0041dbe7;
    }
  }
  else {
    if (thing != (AActor *)0x0) goto LAB_0041dbd7;
LAB_0041db28:
    thing = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      if ((uint)numparam < 3) {
        pcVar3 = "(paramnum) < numparam";
      }
      else {
        if (param[2].field_0.field_3.Type == '\x01') {
          local_40.X = (double)param[1].field_0.field_1.a;
          local_40.Y = (double)param[2].field_0.field_1.a;
          if (numparam == 3) {
            param = defaultparam->Array;
            if (param[3].field_0.field_3.Type == '\0') {
LAB_0041db89:
              bVar1 = P_CheckPosition(thing,&local_40,param[3].field_0.i != 0);
              if (numret < 1) {
                iVar2 = 0;
              }
              else {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                ,0x727,
                                "int AF_AActor_CheckPosition(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                VMReturn::SetInt(ret,(uint)bVar1);
                iVar2 = 1;
              }
              return iVar2;
            }
            pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') goto LAB_0041db89;
            pcVar3 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                        ,0x726,
                        "int AF_AActor_CheckPosition(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar3 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x725,
                    "int AF_AActor_CheckPosition(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar3 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x724,
                "int AF_AActor_CheckPosition(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckPosition)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_BOOL_DEF(actorsonly);
	ACTION_RETURN_BOOL(P_CheckPosition(self, DVector2(x, y), actorsonly));
}